

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

bool check_mist(CHAR_DATA *ch,CHAR_DATA *victim,int dt)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  char *pcVar4;
  char buf2 [4608];
  char buf1 [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  bVar1 = is_awake(victim);
  if (bVar1) {
    sVar2 = get_hitroll(ch);
    iVar3 = number_percent();
    if ((float)iVar3 <= ((float)(int)sVar2 / -250.0 + 1.0) * 50.0) {
      pcVar4 = get_attack_noun(ch,dt);
      sprintf(local_1238,"$n\'s %s passes harmlessly through your cloak of mist.",pcVar4);
      sprintf(local_2438,"Your %s passes harmlessly through $N\'s cloak of mist.",pcVar4);
      act(local_1238,ch,(void *)0x0,victim,2);
      act(local_2438,ch,(void *)0x0,victim,3);
      return true;
    }
  }
  return false;
}

Assistant:

bool check_mist(CHAR_DATA *ch, CHAR_DATA *victim, int dt)
{
	char buf1[MSL], buf2[MSL];
	float chance = 50;
	char *attack;

	if (!is_awake(victim))
		return false;

	chance *= (float)((float)1 - (float)((float)get_hitroll(ch) / (float)250));

	if (number_percent() > chance)
		return false;

	attack = get_dam_message(ch, dt);

	sprintf(buf1, "$n's %s passes harmlessly through your cloak of mist.", attack);
	sprintf(buf2, "Your %s passes harmlessly through $N's cloak of mist.", attack);

	act(buf1, ch, 0, victim, TO_VICT);
	act(buf2, ch, 0, victim, TO_CHAR);
	return true;
}